

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

void json_set_float_serialization_format(char *format)

{
  size_t __n;
  char *__dest;
  
  if (parson_float_format != (char *)0x0) {
    (*parson_free)(parson_float_format);
    parson_float_format = (char *)0x0;
  }
  if (format != (char *)0x0) {
    __n = strlen(format);
    __dest = (char *)(*parson_malloc)(__n + 1);
    if (__dest != (char *)0x0) {
      __dest[__n] = '\0';
      memcpy(__dest,format,__n);
      parson_float_format = __dest;
      return;
    }
  }
  parson_float_format = (char *)0x0;
  return;
}

Assistant:

void json_set_float_serialization_format(const char *format) {
    if (parson_float_format) {
        parson_free(parson_float_format);
        parson_float_format = NULL;
    }
    if (!format) {
        parson_float_format = NULL;
        return;
    }
    parson_float_format = parson_strdup(format);
}